

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManDump(Aig_Man_t *p)

{
  uint uVar1;
  char local_d8 [8];
  char FileName [200];
  Aig_Man_t *p_local;
  
  Aig_ManDump::Counter = Aig_ManDump::Counter + 1;
  FileName._192_8_ = p;
  sprintf(local_d8,"aigbug\\%03d.blif");
  Aig_ManDumpBlif((Aig_Man_t *)FileName._192_8_,local_d8,(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
  uVar1 = Aig_ManNodeNum((Aig_Man_t *)FileName._192_8_);
  printf("Intermediate AIG with %d nodes was written into file \"%s\".\n",(ulong)uVar1,local_d8);
  return;
}

Assistant:

void Aig_ManDump( Aig_Man_t * p )
{ 
    static int Counter = 0;
    char FileName[200];
    // dump the logic into a file
    sprintf( FileName, "aigbug\\%03d.blif", ++Counter );
    Aig_ManDumpBlif( p, FileName, NULL, NULL );
    printf( "Intermediate AIG with %d nodes was written into file \"%s\".\n", Aig_ManNodeNum(p), FileName );
}